

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  char *__nptr;
  CompareOp CVar1;
  ulong uVar2;
  ulong uVar3;
  char *endr;
  char *endl;
  char *local_38;
  char *local_30;
  
  local_38 = rhss;
  local_30 = lhss;
  while( true ) {
    __nptr = local_38;
    if ((9 < (byte)(*local_30 - 0x30U)) && (9 < (byte)(*local_38 - 0x30U))) {
      CVar1 = OP_EQUAL;
      goto LAB_002384dc;
    }
    uVar2 = strtoul(local_30,&local_30,10);
    uVar3 = strtoul(__nptr,&local_38,10);
    if (uVar2 < uVar3) {
      CVar1 = OP_LESS;
      goto LAB_002384dc;
    }
    if (uVar3 < uVar2) break;
    if (*local_38 == '.') {
      local_38 = local_38 + 1;
    }
    if (*local_30 == '.') {
      local_30 = local_30 + 1;
    }
  }
  CVar1 = OP_GREATER;
LAB_002384dc:
  return CVar1 == op;
}

Assistant:

bool cmSystemTools::VersionCompare(cmSystemTools::CompareOp op,
                                   const char* lhss, const char* rhss)
{
  const char *endl = lhss;
  const char *endr = rhss;
  unsigned long lhs, rhs;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9')))
    {
    // Do component-wise comparison.
    lhs = strtoul(endl, const_cast<char**>(&endl), 10);
    rhs = strtoul(endr, const_cast<char**>(&endr), 10);

    if(lhs < rhs)
      {
      // lhs < rhs, so true if operation is LESS
      return op == cmSystemTools::OP_LESS;
      }
    else if(lhs > rhs)
      {
      // lhs > rhs, so true if operation is GREATER
      return op == cmSystemTools::OP_GREATER;
      }

    if (*endr == '.')
      {
      endr++;
      }

    if (*endl == '.')
      {
      endl++;
      }
    }
  // lhs == rhs, so true if operation is EQUAL
  return op == cmSystemTools::OP_EQUAL;
}